

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineDynamicStateCreateInfo *state)

{
  uint uVar1;
  VkDynamicState *__first;
  undefined4 uVar2;
  deUint32 dVar3;
  reference pvVar4;
  allocator<vk::VkDynamicState> local_31;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_30;
  VkPipelineDynamicStateCreateInfo *local_18;
  VkPipelineDynamicStateCreateInfo *state_local;
  PipelineCreateInfo *this_local;
  
  __first = state->pDynamicStates;
  uVar1 = state->dynamicStateCount;
  local_18 = state;
  state_local = (VkPipelineDynamicStateCreateInfo *)this;
  std::allocator<vk::VkDynamicState>::allocator(&local_31);
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)&local_30,__first,
             __first + uVar1,&local_31);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator=
            (&this->m_dynamicStates,&local_30);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector(&local_30);
  std::allocator<vk::VkDynamicState>::~allocator(&local_31);
  uVar2 = *(undefined4 *)&local_18->field_0x4;
  (this->m_dynamicState).sType = local_18->sType;
  *(undefined4 *)&(this->m_dynamicState).field_0x4 = uVar2;
  (this->m_dynamicState).pNext = local_18->pNext;
  dVar3 = local_18->dynamicStateCount;
  (this->m_dynamicState).flags = local_18->flags;
  (this->m_dynamicState).dynamicStateCount = dVar3;
  (this->m_dynamicState).pDynamicStates = local_18->pDynamicStates;
  pvVar4 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator[]
                     (&this->m_dynamicStates,0);
  (this->m_dynamicState).pDynamicStates = pvVar4;
  (this->super_VkGraphicsPipelineCreateInfo).pDynamicState = &this->m_dynamicState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineDynamicStateCreateInfo& state)
{
	m_dynamicStates					= std::vector<vk::VkDynamicState>(state.pDynamicStates, state.pDynamicStates + state.dynamicStateCount);
	m_dynamicState					= state;
	m_dynamicState.pDynamicStates	= &m_dynamicStates[0];
	pDynamicState					= &m_dynamicState;

	return *this;
}